

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionElimination.cc
# Opt level: O0

bool flow::transform::rewriteCondBrToSameBranches(IRHandler *handler)

{
  CondBrInstr *this;
  bool bVar1;
  TerminateInstr *pTVar2;
  BasicBlock *pBVar3;
  BasicBlock *pBVar4;
  BasicBlock *local_90;
  unique_ptr<flow::BrInstr,_std::default_delete<flow::BrInstr>_> local_70;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> local_68;
  undefined1 local_60 [16];
  BasicBlock *nextBB;
  CondBrInstr *condbr;
  BasicBlock *bb;
  iterator __end2;
  iterator __begin2;
  UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
  *__range2;
  IRHandler *handler_local;
  
  ___begin2 = IRHandler::basicBlocks_abi_cxx11_(handler);
  __end2 = util::
           UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
           ::begin((UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
                    *)&__begin2);
  bb = (BasicBlock *)
       util::
       UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
       ::end((UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
              *)&__begin2);
  while( true ) {
    bVar1 = util::
            UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
            ::iterator::operator!=(&__end2,(iterator *)&bb);
    if (!bVar1) {
      return false;
    }
    condbr = (CondBrInstr *)
             util::
             UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
             ::iterator::operator*(&__end2);
    pTVar2 = BasicBlock::getTerminator((BasicBlock *)condbr);
    if (pTVar2 == (TerminateInstr *)0x0) {
      local_90 = (BasicBlock *)0x0;
    }
    else {
      local_90 = (BasicBlock *)
                 __dynamic_cast(pTVar2,&TerminateInstr::typeinfo,&CondBrInstr::typeinfo,0);
    }
    nextBB = local_90;
    if (local_90 != (BasicBlock *)0x0) break;
    util::
    UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
    ::iterator::operator++(&__end2);
  }
  pBVar3 = CondBrInstr::trueBlock((CondBrInstr *)local_90);
  pBVar4 = CondBrInstr::falseBlock((CondBrInstr *)nextBB);
  if (pBVar3 != pBVar4) {
    return false;
  }
  local_60._8_8_ = CondBrInstr::trueBlock((CondBrInstr *)nextBB);
  BasicBlock::remove((BasicBlock *)local_60,(char *)condbr);
  std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::~unique_ptr
            ((unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)local_60);
  this = condbr;
  std::make_unique<flow::BrInstr,flow::BasicBlock*&>((BasicBlock **)&local_70);
  std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>::
  unique_ptr<flow::BrInstr,std::default_delete<flow::BrInstr>,void>
            ((unique_ptr<flow::Instr,std::default_delete<flow::Instr>> *)&local_68,&local_70);
  BasicBlock::push_back((BasicBlock *)this,&local_68);
  std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::~unique_ptr(&local_68);
  std::unique_ptr<flow::BrInstr,_std::default_delete<flow::BrInstr>_>::~unique_ptr(&local_70);
  return true;
}

Assistant:

bool rewriteCondBrToSameBranches(IRHandler* handler) {
  for (BasicBlock* bb : handler->basicBlocks()) {
    // attempt to eliminate useless condbr
    if (CondBrInstr* condbr = dynamic_cast<CondBrInstr*>(bb->getTerminator())) {
      if (condbr->trueBlock() != condbr->falseBlock())
        return false;

      BasicBlock* nextBB = condbr->trueBlock();

      // remove old terminator
      bb->remove(condbr);

      // create new terminator
      bb->push_back(std::make_unique<BrInstr>(nextBB));

      //FLOW_TRACE("flow: rewrote condbr with true-block == false-block");
      return true;
    }
  }

  return false;
}